

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

string * __thiscall czh::token::Pos::get_code_abi_cxx11_(string *__return_storage_ptr__,Pos *this)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  size_type sVar3;
  element_type *peVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  const_iterator local_158;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  size_type local_128;
  size_t arrowpos;
  undefined1 local_118 [8];
  string arrow;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string temp2;
  string temp1;
  size_t total_line;
  size_t actual_next;
  size_t actual_last;
  string local_48;
  size_type local_28;
  size_t linenosize;
  size_t lineno;
  Pos *this_local;
  
  lineno = (size_t)this;
  this_local = (Pos *)__return_storage_ptr__;
  peVar2 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->code);
  iVar1 = (*peVar2->_vptr_File[1])(peVar2,this->pos);
  linenosize = CONCAT44(extraout_var,iVar1);
  actual_last = linenosize + 3;
  utils::to_str<unsigned_long>(&local_48,&actual_last);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  actual_next = 3;
  total_line = 3;
  local_28 = sVar3;
  peVar2 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->code);
  peVar4 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->code);
  iVar1 = (*peVar4->_vptr_File[4])();
  iVar1 = (*peVar2->_vptr_File[1])(peVar2,CONCAT44(extraout_var_00,iVar1) + -1);
  for (; (int)linenosize - (int)actual_next < 1 && actual_next != 0; actual_next = actual_next - 1)
  {
  }
  for (; CONCAT44(extraout_var_01,iVar1) <= linenosize + total_line && total_line != 0;
      total_line = total_line - 1) {
  }
  std::__cxx11::string::string((string *)(temp2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a8);
  peVar2 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->code);
  (**peVar2->_vptr_File)(&local_c8,peVar2,linenosize - actual_next,linenosize + 1,local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&temp2.field_2 + 8),&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (total_line != 0) {
    peVar2 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->code);
    (**peVar2->_vptr_File)
              ((undefined1 *)((long)&arrow.field_2 + 8),peVar2,linenosize + 1,
               linenosize + 1 + total_line,local_28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&arrow.field_2 + 8));
    std::__cxx11::string::~string((string *)(arrow.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"\n",(allocator<char> *)((long)&arrowpos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&arrowpos + 7));
  peVar2 = std::__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<czh::file::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->code);
  iVar1 = (*peVar2->_vptr_File[2])(peVar2,this->pos);
  sVar3 = (CONCAT44(extraout_var_02,iVar1) - this->size) + local_28;
  local_128 = sVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,sVar3,' ',&local_149);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             &local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             "\x1b[0;32;32m");
  local_160._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_118);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_158,&local_160);
  local_168 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_118,local_158,this->size,'^');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             "\x1b[m\n");
  std::operator+(&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&temp2.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
  std::operator+(__return_storage_ptr__,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(temp2.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_code() const
    {
      std::size_t lineno = code->get_lineno(pos);
      std::size_t linenosize = utils::to_str(lineno + next).size();
      std::size_t actual_last = last;
      std::size_t actual_next = next;
      std::size_t total_line = code->get_lineno(code->size() - 1);
    
      while (static_cast<int>(lineno) - static_cast<int>(actual_last) <= 0 && actual_last > 0)
      {
        --actual_last;
      }
      while (lineno + actual_next >= total_line && actual_next > 0)
      {
        --actual_next;
      }
      
      std::string temp1, temp2;
      //lineno - actual_last is impossible to be equal lineno + 1
      temp1 = code->get_spec_line(lineno - actual_last, lineno + 1, linenosize);//[beg, end)
      if (actual_next != 0)
      {//lineno + 1 might be equal to lineno + actual_next + 1
        temp2 = code->get_spec_line(lineno + 1, lineno + actual_next + 1, linenosize);
      }
      std::string arrow("\n");
      std::size_t arrowpos = code->get_arrowpos(pos) - size + linenosize;
      arrow += std::string(arrowpos, ' ');
      arrow += "\033[0;32;32m";
      arrow.insert(arrow.end(), size, '^');
      arrow += "\033[m\n";
      return temp1 + arrow + temp2;
    }